

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O3

inode_type_counter_array * __thiscall
unodb::
mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_growing_inode_counts
          (inode_type_counter_array *__return_storage_ptr__,
          mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *this)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  int iVar4;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar4 == 0) {
    uVar1 = (this->db_).growing_inode_counts._M_elems[1];
    uVar2 = (this->db_).growing_inode_counts._M_elems[2];
    uVar3 = (this->db_).growing_inode_counts._M_elems[3];
    __return_storage_ptr__->_M_elems[0] = (this->db_).growing_inode_counts._M_elems[0];
    __return_storage_ptr__->_M_elems[1] = uVar1;
    __return_storage_ptr__->_M_elems[2] = uVar2;
    __return_storage_ptr__->_M_elems[3] = uVar3;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

[[nodiscard]] auto get_growing_inode_counts() const {
    const std::lock_guard guard{mutex};
    return db_.get_growing_inode_counts();
  }